

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestStringGetTemplate(void)

{
  byte bVar1;
  bool bVar2;
  TemplateString local_3f0;
  TemplateString local_3d0;
  TemplateString local_3b0;
  TemplateString local_390;
  TemplateString local_370;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  Template *local_2d0;
  Template *tpl4;
  TemplateString local_2a8;
  TemplateString local_288;
  TemplateString local_268;
  TemplateString local_248;
  Template *local_228;
  Template *tpl3;
  TemplateCache cache2;
  TemplateString local_1e0;
  TemplateString local_1c0;
  TemplateString local_1a0;
  TemplateString local_180;
  TemplateString local_160;
  Template *local_140;
  Template *tpl1;
  TemplateCache cache1;
  TemplateString local_f8;
  TemplateDictionary local_d8 [8];
  TemplateDictionary empty_dict;
  allocator local_61;
  string local_60 [8];
  string text;
  allocator local_29;
  string local_28 [8];
  string cache_key_a;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"cache key a",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Test template 1",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ctemplate::TemplateString::TemplateString(&local_f8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_d8,&local_f8,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)&tpl1);
  ctemplate::TemplateString::TemplateString(&local_160,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_180,(string *)local_60);
  bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&tpl1,&local_160,(Strip)&local_180);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x8f,
           "cache1.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_1a0,(string *)local_28);
    ctemplate::TemplateString::TemplateString(&local_1c0,(string *)local_60);
    bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&tpl1,&local_1a0,(Strip)&local_1c0);
    if ((bVar1 & 1) == 0) {
      __assert_fail("cache1.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x8f,"static void TemplateCacheUnittest::TestStringGetTemplate()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1e0,(string *)local_28);
  local_140 = (Template *)
              ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl1,(Strip)&local_1e0);
  ctemplate::AssertExpandIs(local_140,local_d8,(string *)local_60,true);
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)&tpl3);
  ctemplate::TemplateString::TemplateString(&local_248,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_268,(string *)local_60);
  bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&tpl3,&local_248,(Strip)&local_268);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x96,
           "cache2.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_288,(string *)local_28);
    ctemplate::TemplateString::TemplateString(&local_2a8,(string *)local_60);
    bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&tpl3,&local_288,(Strip)&local_2a8);
    if ((bVar1 & 1) == 0) {
      __assert_fail("cache2.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x96,"static void TemplateCacheUnittest::TestStringGetTemplate()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl4,(string *)local_28);
  local_228 = (Template *)
              ctemplate::TemplateCache::GetTemplate((TemplateString *)&tpl3,(Strip)&tpl4);
  if (local_228 == local_140) {
    printf("ASSERT FAILED, line %d: %s\n",0x98,"tpl3 != tpl1");
    if (local_228 != local_140) {
      exit(1);
    }
    __assert_fail("tpl3 != tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x98,"static void TemplateCacheUnittest::TestStringGetTemplate()");
  }
  ctemplate::AssertExpandIs(local_228,local_d8,(string *)local_60,true);
  ctemplate::TemplateString::TemplateString(&local_2f0,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_310,(string *)local_60);
  bVar2 = ctemplate::StringToTemplateCache(&local_2f0,&local_310,DO_NOT_STRIP);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x9d,
           "StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_330,(string *)local_28);
    ctemplate::TemplateString::TemplateString(&local_350,(string *)local_60);
    bVar2 = ctemplate::StringToTemplateCache(&local_330,&local_350,DO_NOT_STRIP);
    if (!bVar2) {
      __assert_fail("StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x9d,"static void TemplateCacheUnittest::TestStringGetTemplate()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_370,(string *)local_28);
  local_2d0 = (Template *)ctemplate::Template::GetTemplate(&local_370,DO_NOT_STRIP);
  if (local_2d0 == local_140) {
    printf("ASSERT FAILED, line %d: %s\n",0x9f,"tpl4 != tpl1");
    if (local_2d0 != local_140) {
      exit(1);
    }
    __assert_fail("tpl4 != tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x9f,"static void TemplateCacheUnittest::TestStringGetTemplate()");
  }
  ctemplate::AssertExpandIs(local_2d0,local_d8,(string *)local_60,true);
  ctemplate::TemplateString::TemplateString(&local_390,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_3b0,"new text");
  bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&tpl1,&local_390,(Strip)&local_3b0);
  if ((bVar1 & 1) == 0) {
    ctemplate::Template::ClearCache();
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)&tpl3);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)&tpl1);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_d8);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_28);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xa4,
         "!cache1.StringToTemplateCache(cache_key_a, \"new text\", DO_NOT_STRIP)");
  ctemplate::TemplateString::TemplateString(&local_3d0,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_3f0,"new text");
  bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&tpl1,&local_3d0,(Strip)&local_3f0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!cache1.StringToTemplateCache(cache_key_a, \"new text\", DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0xa4,"static void TemplateCacheUnittest::TestStringGetTemplate()");
  }
  exit(1);
}

Assistant:

static void TestStringGetTemplate() {
    // If you use these same cache keys somewhere else,
    // call Template::ClearCache first.
    const string cache_key_a = "cache key a";
    const string text = "Test template 1";
    TemplateDictionary empty_dict("dict");

    TemplateCache cache1;
    const Template *tpl1;
    ASSERT(cache1.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));
    tpl1 = cache1.GetTemplate(cache_key_a, DO_NOT_STRIP);
    AssertExpandIs(tpl1, &empty_dict, text, true);

    // A different cache should give different templates.
    TemplateCache cache2;
    const Template *tpl3;
    ASSERT(cache2.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));
    tpl3 = cache2.GetTemplate(cache_key_a, DO_NOT_STRIP);
    ASSERT(tpl3 != tpl1);
    AssertExpandIs(tpl3, &empty_dict, text, true);

    // And the main cache different still
    const Template *tpl4;
    ASSERT(StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));
    tpl4 = Template::GetTemplate(cache_key_a, DO_NOT_STRIP);
    ASSERT(tpl4 != tpl1);
    AssertExpandIs(tpl4, &empty_dict, text, true);

    // If we register a new string with the same text, it should be ignored.
    ASSERT(!cache1.StringToTemplateCache(cache_key_a, "new text",
                                         DO_NOT_STRIP));

    Template::ClearCache();
  }